

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellABecLap.cpp
# Opt level: O2

void __thiscall
amrex::MLCellABecLap::applyInhomogNeumannTerm(MLCellABecLap *this,int amrlev,Any *a_rhs)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  LinOpBCType LVar7;
  __uniq_ptr_data<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>,_true,_true> _Var8;
  Box *this_00;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  FabArray<amrex::FArrayBox> *fabarray_;
  long lVar15;
  long lVar16;
  long lVar17;
  int *piVar18;
  long lVar19;
  byte bVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  int j;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar40;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar41;
  double dVar42;
  IntVect IVar43;
  long local_540;
  long local_538;
  long local_530;
  long local_520;
  Array4<double> local_508;
  Array4<const_double> local_4c8;
  long local_488;
  long local_480;
  long local_478;
  long local_470;
  long local_468;
  long local_460;
  long local_458;
  long local_450;
  long local_448;
  long local_440;
  long local_438;
  long local_430;
  long local_428;
  ulong local_420;
  long local_418;
  long local_410;
  long local_408;
  int local_3fc;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  long local_3c0;
  long local_3b8;
  MLCellABecLap *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  long local_398;
  long local_390;
  IntVect hi;
  undefined4 uStack_37c;
  long local_378;
  int local_368;
  int local_364;
  int local_360;
  IntVect low;
  undefined4 uStack_33c;
  long local_338;
  int local_328;
  int local_324;
  int local_320;
  Array4<const_double> local_2e0;
  int local_29c;
  LinOpBCType local_298;
  int local_294;
  Array4<const_double> local_290;
  Box bhi;
  Box blo;
  Box local_1f4;
  long local_1d8;
  FabArray<amrex::FArrayBox> *local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  Real fac;
  long local_1a0;
  long local_198;
  double local_190;
  double local_188;
  Box *local_180;
  long local_178;
  long local_170;
  long local_168;
  Vector<int,_std::allocator<int>_> *local_160;
  pointer local_158;
  long *local_150;
  LinOpBCType *local_148;
  LinOpBCType *local_140;
  ulong local_138;
  long local_130;
  long local_128;
  ulong local_120;
  ulong local_118;
  FArrayBox foo;
  MFIter mfi;
  long local_60 [3];
  MFItInfo local_44;
  
  bVar10 = MLLinOp::hasInhomogNeumannBC((MLLinOp *)this);
  bVar11 = MLLinOp::hasRobinBC((MLLinOp *)this);
  if (bVar10 || bVar11) {
    fabarray_ = &Any::get<amrex::MultiFab>(a_rhs)->super_FabArray<amrex::FArrayBox>;
    uVar13 = (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[5])(this);
    lVar36 = (long)amrlev;
    lVar23 = *(long *)&(this->super_MLCellLinOp).super_MLLinOp.m_geom.
                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar36].
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    local_188 = *(double *)(lVar23 + 0x58);
    local_190 = *(double *)(lVar23 + 0x20);
    dVar3 = *(double *)(lVar23 + 0x38);
    dVar4 = *(double *)(lVar23 + 0x40);
    dVar5 = *(double *)(lVar23 + 0x48);
    (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[0x4c])(this);
    dVar42 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[0x4e])(local_60,this,amrlev,0);
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
    mfi.fabArray = (FabArrayBase *)0x100000000;
    mfi.tile_size.vect[0] = 1;
    mfi.tile_size.vect[1] = 1;
    mfi.tile_size.vect[2] = 0;
    FArrayBox::FArrayBox(&foo,(Box *)&mfi,1,true,false,(Arena *)0x0);
    local_198 = *(long *)&(this->super_MLCellLinOp).m_maskvals.
                          super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar36].
                          super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                          .
                          super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
    ;
    local_1d8 = **(long **)&(this->super_MLCellLinOp).m_bcondloc.
                            super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar36].
                            super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
    ;
    _Var8.super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
    super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
         (this->super_MLCellLinOp).m_bndry_sol.
         super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar36]._M_t.
         super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>;
    local_44.do_tiling = false;
    local_44.dynamic = true;
    local_44.device_sync = true;
    local_44.num_streams = Gpu::Device::max_gpu_streams;
    local_44.tilesize.vect[0] = 0;
    local_44.tilesize.vect[1] = 0;
    local_460 = local_60[0];
    local_44.tilesize.vect[2] = 0;
    local_1d0 = fabarray_;
    local_168 = lVar36;
    MFIter::MFIter(&mfi,&fabarray_->super_FabArrayBase,&local_44);
    local_180 = (Box *)(lVar23 + 0xac);
    local_1a0 = (long)_Var8.
                      super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                      .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl + 8;
    fac = dVar4 * dVar42;
    local_1b0 = dVar3 * dVar42;
    dVar42 = dVar42 * dVar5;
    local_1b8 = dVar4 * fac;
    local_1c0 = dVar3 * local_1b0;
    local_1c8 = dVar5 * dVar42;
    if ((int)uVar13 < 1) {
      uVar13 = 0;
    }
    local_138 = (ulong)uVar13;
    local_3b0 = this;
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::validbox(&local_1f4,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_508,local_1d0,&mfi);
      piVar18 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar18 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      local_150 = (long *)((long)*piVar18 * 0x18 + *(long *)(local_1d8 + 0xf0));
      lVar23 = 0;
      while (local_478 = lVar23, lVar23 != 3) {
        if (local_460 == 0) {
          local_4c8.begin.y = foo.super_BaseFab<double>.domain.smallend.vect[1];
          local_4c8.begin.x = foo.super_BaseFab<double>.domain.smallend.vect[0];
          local_4c8.p = foo.super_BaseFab<double>.dptr;
          local_4c8.jstride =
               ((long)foo.super_BaseFab<double>.domain.bigend.vect[0] -
               (long)foo.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
          local_4c8.kstride =
               (((long)foo.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
               (long)foo.super_BaseFab<double>.domain.smallend.vect[1]) * local_4c8.jstride;
          local_4c8.nstride =
               (((long)foo.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
               (long)foo.super_BaseFab<double>.domain.smallend.vect[2]) * local_4c8.kstride;
          local_4c8.begin.z = foo.super_BaseFab<double>.domain.smallend.vect[2];
          local_4c8.end._0_8_ =
               (long)foo.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
               (long)foo.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
          local_4c8.end.z = (int)((long)foo.super_BaseFab<double>.domain.bigend.vect[2] + 1);
          local_4c8.ncomp = foo.super_BaseFab<double>.nvar;
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_4c8,(FabArray<amrex::FArrayBox> *)local_60[lVar23],&mfi);
        }
        low.vect[2] = local_1f4.smallend.vect[2];
        low.vect[0] = local_1f4.smallend.vect[0];
        low.vect[1] = local_1f4.smallend.vect[1];
        hi.vect[2] = local_1f4.bigend.vect[2];
        hi.vect[0] = local_1f4.bigend.vect[0];
        hi.vect[1] = local_1f4.bigend.vect[1];
        iVar14 = low.vect[lVar23] + -1;
        low.vect[lVar23] = iVar14;
        hi.vect[lVar23] = iVar14;
        blo.btype.itype = local_1f4.btype.itype & ~(1 << ((uint)lVar23 & 0x1f));
        blo.smallend.vect[0] = low.vect[0];
        blo.smallend.vect[1] = low.vect[1];
        blo.smallend.vect[2] = low.vect[2];
        blo.bigend.vect[0] = hi.vect[0];
        blo.bigend.vect[1] = hi.vect[1];
        blo.bigend.vect[2] = hi.vect[2];
        low.vect[2] = local_1f4.smallend.vect[2];
        low.vect[0] = local_1f4.smallend.vect[0];
        low.vect[1] = local_1f4.smallend.vect[1];
        hi.vect[2] = local_1f4.bigend.vect[2];
        hi.vect[0] = local_1f4.bigend.vect[0];
        hi.vect[1] = local_1f4.bigend.vect[1];
        IVar43 = Box::type(&local_1f4);
        local_2e0.p = IVar43.vect._0_8_;
        local_2e0.jstride._0_4_ = IVar43.vect[2];
        iVar14 = (~*(uint *)((long)&local_2e0.p + lVar23 * 4) & 1) + hi.vect[lVar23];
        low.vect[lVar23] = iVar14;
        hi.vect[lVar23] = iVar14;
        lVar36 = local_198;
        bhi.btype.itype = local_1f4.btype.itype & ~(1 << ((uint)lVar23 & 0x1f));
        bhi.smallend.vect[0] = low.vect[0];
        bhi.smallend.vect[1] = low.vect[1];
        bhi.smallend.vect[2] = low.vect[2];
        bhi.bigend.vect[0] = hi.vect[0];
        bhi.bigend.vect[1] = hi.vect[1];
        bhi.bigend.vect[2] = hi.vect[2];
        lVar23 = lVar23 * 0x180;
        FabArray<amrex::Mask>::array<amrex::Mask,_0>
                  ((Array4<const_int> *)&low,(FabArray<amrex::Mask> *)(local_198 + lVar23),&mfi);
        FabArray<amrex::Mask>::array<amrex::Mask,_0>
                  ((Array4<const_int> *)&hi,(FabArray<amrex::Mask> *)(lVar36 + lVar23 + 0x480),&mfi)
        ;
        lVar36 = local_1a0;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_2e0,(FabArray<amrex::FArrayBox> *)(local_1a0 + lVar23),&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_290,(FabArray<amrex::FArrayBox> *)(lVar36 + lVar23 + 0x480),&mfi);
        this_00 = local_180;
        bVar10 = Box::contains(local_180,&blo);
        bVar12 = Box::contains(this_00,&bhi);
        if (!bVar10 || !bVar12) {
          local_148 = ((this->super_MLCellLinOp).super_MLLinOp.m_lobc_orig.
                       super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                       .
                       super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + local_478;
          bVar20 = local_460 == 0 & (this->super_MLCellLinOp).m_has_metric_term;
          local_438 = (long)blo.smallend.vect[1];
          local_3f0 = (long)blo.smallend.vect[2];
          local_408 = (long)blo.bigend.vect[0];
          local_410 = (long)blo.bigend.vect[1];
          local_428 = (long)blo.bigend.vect[2];
          local_140 = ((this->super_MLCellLinOp).super_MLLinOp.m_hibc_orig.
                       super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                       .
                       super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + local_478;
          local_440 = (long)bhi.smallend.vect[1];
          local_3f8 = (long)bhi.smallend.vect[2];
          lVar26 = (long)bhi.bigend.vect[0];
          local_418 = (long)bhi.bigend.vect[1];
          local_170 = (long)mfi.currentIndex * 4;
          local_430 = (long)bhi.bigend.vect[2];
          local_158 = (this->super_MLCellLinOp).m_robin_bcval.
                      super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_160 = mfi.local_index_map;
          local_118 = blo.smallend.vect._0_8_ & 0xffffffff;
          lVar30 = (long)blo.smallend.vect[0];
          local_120 = bhi.smallend.vect._0_8_ & 0xffffffff;
          lVar24 = (long)bhi.smallend.vect[0];
          local_390 = lVar30 * 4;
          local_468 = lVar30 * 8;
          local_3a0 = blo.smallend.vect[1] + 1;
          local_294 = blo.smallend.vect[0] + 1;
          local_29c = blo.smallend.vect[2] + 1;
          local_398 = lVar24 * 4;
          local_480 = lVar24 * 8;
          local_3fc = bhi.smallend.vect[1] + -1;
          local_39c = bhi.smallend.vect[0] + -1;
          local_3a4 = bhi.smallend.vect[2] + -1;
          local_128 = local_438 + 1;
          lVar23 = local_438 * 8;
          lVar36 = local_3f0 * 8;
          local_178 = local_3f0 + 1;
          lVar1 = local_440 * 8;
          lVar2 = local_3f8 * 8;
          local_448 = 0x10;
          local_450 = 0;
          local_458 = 8;
          local_530 = 0;
          uVar9 = 0;
          while (uVar31 = uVar9, uVar31 != local_138) {
            lVar15 = uVar31 * 0x18 + *local_150;
            iVar14 = *(int *)(lVar15 + 0xc + local_478 * 4);
            LVar7 = local_148[uVar31 * 3];
            iVar21 = (int)local_478;
            if (LVar7 == inhomogNeumann && !bVar10) {
              iVar28 = *(int *)(lVar15 + local_478 * 4);
              if (iVar21 == 1) {
                lVar15 = local_3f0;
                if (bVar20 == 0) {
                  for (; lVar19 = local_438, iVar27 = local_3a0, (int)lVar15 <= blo.bigend.vect[2];
                      lVar15 = lVar15 + 1) {
                    while ((int)lVar19 <= blo.bigend.vect[1]) {
                      lVar16 = local_508.nstride * local_530 +
                               (iVar27 - local_508.begin.y) * local_508.jstride * 8 +
                               (lVar15 - local_508.begin.z) * local_508.kstride * 8 +
                               (long)local_508.begin.x * -8 + local_468;
                      for (lVar22 = 0; lVar30 + lVar22 <= local_408; lVar22 = lVar22 + 1) {
                        if ((iVar28 == 0x66) &&
                           (*(int *)((lVar19 - local_324) * CONCAT44(uStack_33c,low.vect[2]) * 4 +
                                     (lVar15 - local_320) * local_338 * 4 + (long)local_328 * -4 +
                                     low.vect._0_8_ + local_390 + lVar22 * 4) == 2)) {
                          uVar40 = 0;
                          uVar41 = 0x3ff00000;
                          if (local_460 != 0) {
                            uVar6 = *(undefined8 *)
                                     ((long)local_4c8.p +
                                     lVar22 * 8 +
                                     local_4c8.nstride * local_530 +
                                     (iVar27 - local_4c8.begin.y) * local_4c8.jstride * 8 +
                                     (lVar15 - local_4c8.begin.z) * local_4c8.kstride * 8 +
                                     (long)local_4c8.begin.x * -8 + local_468);
                            uVar40 = (undefined4)uVar6;
                            uVar41 = (undefined4)((ulong)uVar6 >> 0x20);
                          }
                          *(double *)((long)local_508.p + lVar22 * 8 + lVar16) =
                               *(double *)((long)local_508.p + lVar22 * 8 + lVar16) -
                               (double)CONCAT44(uVar41,uVar40) * fac *
                               *(double *)
                                ((long)local_2e0.p +
                                lVar22 * 8 +
                                local_2e0.nstride * local_530 +
                                (lVar15 - local_2e0.begin.z) * local_2e0.kstride * 8 +
                                (lVar19 - local_2e0.begin.y) *
                                CONCAT44(local_2e0.jstride._4_4_,(int)local_2e0.jstride) * 8 +
                                (long)local_2e0.begin.x * -8 + local_468);
                        }
                      }
                      iVar27 = iVar27 + 1;
                      lVar19 = lVar19 + 1;
                    }
                  }
                }
                else {
                  for (; lVar19 = local_438, iVar27 = local_3a0, (int)lVar15 <= blo.bigend.vect[2];
                      lVar15 = lVar15 + 1) {
                    while ((int)lVar19 <= blo.bigend.vect[1]) {
                      lVar16 = local_508.nstride * local_530 +
                               (iVar27 - local_508.begin.y) * local_508.jstride * 8 +
                               (lVar15 - local_508.begin.z) * local_508.kstride * 8 +
                               (long)local_508.begin.x * -8 + local_468;
                      for (lVar22 = 0; lVar30 + lVar22 <= local_408; lVar22 = lVar22 + 1) {
                        if ((iVar28 == 0x66) &&
                           (*(int *)((lVar19 - local_324) * CONCAT44(uStack_33c,low.vect[2]) * 4 +
                                     (lVar15 - local_320) * local_338 * 4 + (long)local_328 * -4 +
                                     low.vect._0_8_ + local_390 + lVar22 * 4) == 2)) {
                          *(double *)((long)local_508.p + lVar22 * 8 + lVar16) =
                               *(double *)((long)local_508.p + lVar22 * 8 + lVar16) -
                               (((double)((int)lVar22 + blo.smallend.vect[0]) + 0.5) * local_190 +
                               local_188) * fac *
                               *(double *)
                                ((long)local_2e0.p +
                                lVar22 * 8 +
                                local_2e0.nstride * local_530 +
                                (lVar19 - local_2e0.begin.y) *
                                CONCAT44(local_2e0.jstride._4_4_,(int)local_2e0.jstride) * 8 +
                                (lVar15 - local_2e0.begin.z) * local_2e0.kstride * 8 +
                                (long)local_2e0.begin.x * -8 + local_468);
                        }
                      }
                      iVar27 = iVar27 + 1;
                      lVar19 = lVar19 + 1;
                    }
                  }
                }
              }
              else {
                lVar15 = local_3f0;
                iVar27 = blo.smallend.vect[2] + 1;
                if (iVar21 == 0) {
                  for (; iVar27 = (int)lVar15, lVar19 = local_438, iVar27 <= blo.bigend.vect[2];
                      lVar15 = lVar15 + 1) {
                    for (; iVar35 = (int)lVar19, iVar35 <= blo.bigend.vect[1]; lVar19 = lVar19 + 1)
                    {
                      lVar22 = ((long)iVar35 - (long)local_508.begin.y) * local_508.jstride;
                      lVar16 = ((long)iVar27 - (long)local_508.begin.z) * local_508.kstride;
                      for (lVar25 = 0; lVar30 + lVar25 <= local_408; lVar25 = lVar25 + 1) {
                        if ((iVar28 == 0x66) &&
                           (*(int *)((lVar19 - local_324) * CONCAT44(uStack_33c,low.vect[2]) * 4 +
                                     (lVar15 - local_320) * local_338 * 4 + (long)local_328 * -4 +
                                     low.vect._0_8_ + local_390 + lVar25 * 4) == 2)) {
                          uVar40 = 0;
                          uVar41 = 0x3ff00000;
                          if (local_460 != 0) {
                            uVar40 = SUB84(local_4c8.p
                                           [((long)iVar35 - (long)local_4c8.begin.y) *
                                            local_4c8.jstride +
                                            ((long)iVar27 - (long)local_4c8.begin.z) *
                                            local_4c8.kstride +
                                            local_4c8.nstride * uVar31 +
                                            (long)((local_294 - local_4c8.begin.x) + (int)lVar25)],0
                                          );
                            uVar41 = (undefined4)
                                     ((ulong)local_4c8.p
                                             [((long)iVar35 - (long)local_4c8.begin.y) *
                                              local_4c8.jstride +
                                              ((long)iVar27 - (long)local_4c8.begin.z) *
                                              local_4c8.kstride +
                                              local_4c8.nstride * uVar31 +
                                              (long)((local_294 - local_4c8.begin.x) + (int)lVar25)]
                                     >> 0x20);
                          }
                          lVar17 = (long)((local_294 - local_508.begin.x) + (int)lVar25);
                          local_508.p[lVar22 + lVar16 + local_508.nstride * uVar31 + lVar17] =
                               local_508.p[lVar22 + lVar16 + local_508.nstride * uVar31 + lVar17] -
                               (double)CONCAT44(uVar41,uVar40) * local_1b0 *
                               *(double *)
                                ((long)local_2e0.p +
                                lVar25 * 8 +
                                local_2e0.nstride * local_530 +
                                (lVar19 - local_2e0.begin.y) *
                                CONCAT44(local_2e0.jstride._4_4_,(int)local_2e0.jstride) * 8 +
                                (lVar15 - local_2e0.begin.z) * local_2e0.kstride * 8 +
                                (long)local_2e0.begin.x * -8 + local_468);
                        }
                      }
                    }
                  }
                }
                else {
                  while ((int)lVar15 <= blo.bigend.vect[2]) {
                    for (lVar19 = local_438; (int)lVar19 <= blo.bigend.vect[1]; lVar19 = lVar19 + 1)
                    {
                      lVar16 = local_508.nstride * local_530 +
                               (iVar27 - local_508.begin.z) * local_508.kstride * 8 +
                               (lVar19 - local_508.begin.y) * local_508.jstride * 8 +
                               (long)local_508.begin.x * -8 + local_468;
                      for (lVar22 = 0; lVar30 + lVar22 <= local_408; lVar22 = lVar22 + 1) {
                        if ((iVar28 == 0x66) &&
                           (*(int *)((lVar19 - local_324) * CONCAT44(uStack_33c,low.vect[2]) * 4 +
                                     (lVar15 - local_320) * local_338 * 4 + (long)local_328 * -4 +
                                     low.vect._0_8_ + local_390 + lVar22 * 4) == 2)) {
                          uVar40 = 0;
                          uVar41 = 0x3ff00000;
                          if (local_460 != 0) {
                            uVar6 = *(undefined8 *)
                                     ((long)local_4c8.p +
                                     lVar22 * 8 +
                                     local_4c8.nstride * local_530 +
                                     (iVar27 - local_4c8.begin.z) * local_4c8.kstride * 8 +
                                     (lVar19 - local_4c8.begin.y) * local_4c8.jstride * 8 +
                                     (long)local_4c8.begin.x * -8 + local_468);
                            uVar40 = (undefined4)uVar6;
                            uVar41 = (undefined4)((ulong)uVar6 >> 0x20);
                          }
                          *(double *)((long)local_508.p + lVar22 * 8 + lVar16) =
                               *(double *)((long)local_508.p + lVar22 * 8 + lVar16) -
                               (double)CONCAT44(uVar41,uVar40) * dVar42 *
                               *(double *)
                                ((long)local_2e0.p +
                                lVar22 * 8 +
                                local_2e0.nstride * local_530 +
                                (lVar19 - local_2e0.begin.y) *
                                CONCAT44(local_2e0.jstride._4_4_,(int)local_2e0.jstride) * 8 +
                                (lVar15 - local_2e0.begin.z) * local_2e0.kstride * 8 +
                                (long)local_2e0.begin.x * -8 + local_468);
                        }
                      }
                    }
                    iVar27 = iVar27 + 1;
                    lVar15 = lVar15 + 1;
                  }
                }
              }
            }
            local_298 = local_140[uVar31 * 3];
            if (local_298 == inhomogNeumann && !bVar12) {
              if (iVar21 == 1) {
                lVar15 = local_3f8;
                if (bVar20 == 0) {
                  for (; lVar19 = local_440, iVar28 = local_3fc, (int)lVar15 <= bhi.bigend.vect[2];
                      lVar15 = lVar15 + 1) {
                    for (; (int)lVar19 <= bhi.bigend.vect[1]; lVar19 = lVar19 + 1) {
                      lVar16 = local_508.nstride * local_530 +
                               (iVar28 - local_508.begin.y) * local_508.jstride * 8 +
                               (lVar15 - local_508.begin.z) * local_508.kstride * 8 +
                               (long)local_508.begin.x * -8 + local_480;
                      for (lVar22 = 0; lVar24 + lVar22 <= lVar26; lVar22 = lVar22 + 1) {
                        if ((iVar14 == 0x66) &&
                           (*(int *)((lVar19 - local_364) * CONCAT44(uStack_37c,hi.vect[2]) * 4 +
                                     (lVar15 - local_360) * local_378 * 4 + (long)local_368 * -4 +
                                     hi.vect._0_8_ + local_398 + lVar22 * 4) == 2)) {
                          uVar40 = 0;
                          uVar41 = 0x3ff00000;
                          if (local_460 != 0) {
                            uVar6 = *(undefined8 *)
                                     ((long)local_4c8.p +
                                     lVar22 * 8 +
                                     local_4c8.nstride * local_530 +
                                     (lVar19 - local_4c8.begin.y) * local_4c8.jstride * 8 +
                                     (lVar15 - local_4c8.begin.z) * local_4c8.kstride * 8 +
                                     (long)local_4c8.begin.x * -8 + local_480);
                            uVar40 = (undefined4)uVar6;
                            uVar41 = (undefined4)((ulong)uVar6 >> 0x20);
                          }
                          *(double *)((long)local_508.p + lVar22 * 8 + lVar16) =
                               (double)CONCAT44(uVar41,uVar40) * fac *
                               *(double *)
                                ((long)local_290.p +
                                lVar22 * 8 +
                                local_290.nstride * local_530 +
                                (lVar19 - local_290.begin.y) * local_290.jstride * 8 +
                                (lVar15 - local_290.begin.z) * local_290.kstride * 8 +
                                (long)local_290.begin.x * -8 + local_480) +
                               *(double *)((long)local_508.p + lVar22 * 8 + lVar16);
                        }
                      }
                      iVar28 = iVar28 + 1;
                    }
                  }
                }
                else {
                  for (; lVar19 = local_440, iVar28 = local_3fc, (int)lVar15 <= bhi.bigend.vect[2];
                      lVar15 = lVar15 + 1) {
                    for (; (int)lVar19 <= bhi.bigend.vect[1]; lVar19 = lVar19 + 1) {
                      lVar16 = local_508.nstride * local_530 +
                               (iVar28 - local_508.begin.y) * local_508.jstride * 8 +
                               (lVar15 - local_508.begin.z) * local_508.kstride * 8 +
                               (long)local_508.begin.x * -8 + local_480;
                      for (lVar22 = 0; lVar24 + lVar22 <= lVar26; lVar22 = lVar22 + 1) {
                        if ((iVar14 == 0x66) &&
                           (*(int *)((lVar19 - local_364) * CONCAT44(uStack_37c,hi.vect[2]) * 4 +
                                     (lVar15 - local_360) * local_378 * 4 + (long)local_368 * -4 +
                                     hi.vect._0_8_ + local_398 + lVar22 * 4) == 2)) {
                          *(double *)((long)local_508.p + lVar22 * 8 + lVar16) =
                               (((double)(bhi.smallend.vect[0] + (int)lVar22) + 0.5) * local_190 +
                               local_188) * fac *
                               *(double *)
                                ((long)local_290.p +
                                lVar22 * 8 +
                                local_290.nstride * local_530 +
                                (lVar19 - local_290.begin.y) * local_290.jstride * 8 +
                                (lVar15 - local_290.begin.z) * local_290.kstride * 8 +
                                (long)local_290.begin.x * -8 + local_480) +
                               *(double *)((long)local_508.p + lVar22 * 8 + lVar16);
                        }
                      }
                      iVar28 = iVar28 + 1;
                    }
                  }
                }
              }
              else {
                lVar15 = local_3f8;
                iVar28 = local_3a4;
                if (iVar21 == 0) {
                  for (; lVar19 = local_440, (int)lVar15 <= bhi.bigend.vect[2]; lVar15 = lVar15 + 1)
                  {
                    for (; (int)lVar19 <= bhi.bigend.vect[1]; lVar19 = lVar19 + 1) {
                      lVar22 = ((long)(int)lVar19 - (long)local_508.begin.y) * local_508.jstride;
                      lVar16 = ((long)(int)lVar15 - (long)local_508.begin.z) * local_508.kstride;
                      for (lVar25 = 0; lVar24 + lVar25 <= lVar26; lVar25 = lVar25 + 1) {
                        if ((iVar14 == 0x66) &&
                           (*(int *)((lVar19 - local_364) * CONCAT44(uStack_37c,hi.vect[2]) * 4 +
                                     (lVar15 - local_360) * local_378 * 4 + (long)local_368 * -4 +
                                     hi.vect._0_8_ + local_398 + lVar25 * 4) == 2)) {
                          uVar40 = 0;
                          uVar41 = 0x3ff00000;
                          if (local_460 != 0) {
                            uVar6 = *(undefined8 *)
                                     ((long)local_4c8.p +
                                     lVar25 * 8 +
                                     local_4c8.nstride * local_530 +
                                     (lVar19 - local_4c8.begin.y) * local_4c8.jstride * 8 +
                                     (lVar15 - local_4c8.begin.z) * local_4c8.kstride * 8 +
                                     (long)local_4c8.begin.x * -8 + local_480);
                            uVar40 = (undefined4)uVar6;
                            uVar41 = (undefined4)((ulong)uVar6 >> 0x20);
                          }
                          lVar17 = (long)((local_39c - local_508.begin.x) + (int)lVar25);
                          local_508.p[lVar22 + lVar16 + local_508.nstride * uVar31 + lVar17] =
                               (double)CONCAT44(uVar41,uVar40) * local_1b0 *
                               *(double *)
                                ((long)local_290.p +
                                lVar25 * 8 +
                                local_290.nstride * local_530 +
                                (lVar19 - local_290.begin.y) * local_290.jstride * 8 +
                                (lVar15 - local_290.begin.z) * local_290.kstride * 8 +
                                (long)local_290.begin.x * -8 + local_480) +
                               local_508.p[lVar22 + lVar16 + local_508.nstride * uVar31 + lVar17];
                        }
                      }
                    }
                  }
                }
                else {
                  for (; lVar19 = local_440, (int)lVar15 <= bhi.bigend.vect[2]; lVar15 = lVar15 + 1)
                  {
                    for (; (int)lVar19 <= bhi.bigend.vect[1]; lVar19 = lVar19 + 1) {
                      lVar16 = local_508.nstride * local_530 +
                               (iVar28 - local_508.begin.z) * local_508.kstride * 8 +
                               (lVar19 - local_508.begin.y) * local_508.jstride * 8 +
                               (long)local_508.begin.x * -8 + local_480;
                      for (lVar22 = 0; lVar24 + lVar22 <= lVar26; lVar22 = lVar22 + 1) {
                        if ((iVar14 == 0x66) &&
                           (*(int *)((lVar19 - local_364) * CONCAT44(uStack_37c,hi.vect[2]) * 4 +
                                     (lVar15 - local_360) * local_378 * 4 + (long)local_368 * -4 +
                                     hi.vect._0_8_ + local_398 + lVar22 * 4) == 2)) {
                          uVar40 = 0;
                          uVar41 = 0x3ff00000;
                          if (local_460 != 0) {
                            uVar6 = *(undefined8 *)
                                     ((long)local_4c8.p +
                                     lVar22 * 8 +
                                     local_4c8.nstride * local_530 +
                                     (lVar19 - local_4c8.begin.y) * local_4c8.jstride * 8 +
                                     (lVar15 - local_4c8.begin.z) * local_4c8.kstride * 8 +
                                     (long)local_4c8.begin.x * -8 + local_480);
                            uVar40 = (undefined4)uVar6;
                            uVar41 = (undefined4)((ulong)uVar6 >> 0x20);
                          }
                          *(double *)((long)local_508.p + lVar22 * 8 + lVar16) =
                               (double)CONCAT44(uVar41,uVar40) * dVar42 *
                               *(double *)
                                ((long)local_290.p +
                                lVar22 * 8 +
                                local_290.nstride * local_530 +
                                (lVar19 - local_290.begin.y) * local_290.jstride * 8 +
                                (lVar15 - local_290.begin.z) * local_290.kstride * 8 +
                                (long)local_290.begin.x * -8 + local_480) +
                               *(double *)((long)local_508.p + lVar22 * 8 + lVar16);
                        }
                      }
                    }
                    iVar28 = iVar28 + 1;
                  }
                }
              }
            }
            if (bVar11) {
              piVar18 = &mfi.currentIndex;
              if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                piVar18 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + mfi.currentIndex;
              }
              lVar15 = *(long *)(*(long *)((long)local_158[local_168]._M_t.
                                                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                          + 0x108) + (long)*piVar18 * 8);
              local_3c0 = *(long *)(lVar15 + 0x10);
              local_3c8 = (long)*(int *)(lVar15 + 0x18);
              local_3e0 = (long)*(int *)(lVar15 + 0x1c);
              local_3e8 = (long)*(int *)(lVar15 + 0x20);
              local_3d0 = (long)((*(int *)(lVar15 + 0x24) - *(int *)(lVar15 + 0x18)) + 1);
              local_3d8 = (long)((*(int *)(lVar15 + 0x28) - *(int *)(lVar15 + 0x1c)) + 1);
              lVar15 = (long)((*(int *)(lVar15 + 0x2c) - *(int *)(lVar15 + 0x20)) + 1);
              if (LVar7 == Robin && !bVar10) {
                if (iVar21 == 0) {
                  lVar22 = local_468 + local_3c0;
                  lVar17 = ((local_458 * lVar15 + lVar36 + local_3e8 * -8) * local_3d8 + lVar23 +
                           local_3e0 * -8) * local_3d0 + local_3c8 * -8 + lVar22;
                  local_3b8 = local_3d8 * local_3d0 * 8;
                  lVar19 = local_3d0 * 8;
                  lVar16 = ((local_450 * lVar15 + lVar36 + local_3e8 * -8) * local_3d8 + lVar23 +
                           local_3e0 * -8) * local_3d0 + local_3c8 * -8 + lVar22;
                  lVar22 = ((local_448 * lVar15 + lVar36 + local_3e8 * -8) * local_3d8 + lVar23 +
                           local_3e0 * -8) * local_3d0 + local_3c8 * -8 + lVar22;
                  for (lVar25 = local_3f0; lVar33 = lVar22, lVar37 = lVar16, lVar16 = lVar37,
                      lVar22 = lVar33, lVar32 = lVar17, lVar39 = local_438, lVar25 <= local_428;
                      lVar25 = lVar25 + 1) {
                    for (; lVar39 <= local_410; lVar39 = lVar39 + 1) {
                      lVar34 = ((lVar39 - local_508.begin.y) * local_508.jstride +
                               (lVar25 - local_508.begin.z) * local_508.kstride + lVar30) * 8 +
                               local_508.nstride * local_530 + (long)local_508.begin.x * -8 + 8;
                      for (lVar38 = 0; lVar30 + lVar38 <= local_408; lVar38 = lVar38 + 1) {
                        *(double *)((long)local_508.p + lVar38 * 8 + lVar34) =
                             *(double *)
                              ((long)local_4c8.p +
                              lVar38 * 8 +
                              local_4c8.nstride * local_530 +
                              ((lVar39 - local_4c8.begin.y) * local_4c8.jstride +
                              (lVar25 - local_4c8.begin.z) * local_4c8.kstride + lVar30) * 8 +
                              (long)local_4c8.begin.x * -8 + 8) * local_1c0 *
                             (*(double *)(lVar22 + lVar38 * 8) /
                             (*(double *)(lVar32 + lVar38 * 8) * dVar3 +
                             *(double *)(lVar16 + lVar38 * 8) * 0.5)) +
                             *(double *)((long)local_508.p + lVar38 * 8 + lVar34);
                      }
                      lVar16 = lVar16 + lVar19;
                      lVar22 = lVar22 + lVar19;
                      lVar32 = lVar32 + lVar19;
                    }
                    lVar17 = lVar17 + local_3b8;
                    lVar16 = lVar37 + local_3b8;
                    lVar22 = lVar33 + local_3b8;
                    local_488 = lVar37;
                    local_470 = lVar33;
                  }
                }
                else if (iVar21 == 1) {
                  local_470 = local_468 + local_3c0;
                  lVar22 = ((local_458 * lVar15 + lVar36 + local_3e8 * -8) * local_3d8 + lVar23 +
                           local_3e0 * -8) * local_3d0 + local_3c8 * -8 + local_470;
                  local_3b8 = local_3d8 * local_3d0 * 8;
                  lVar19 = local_3d0 * 8;
                  local_488 = ((local_450 * lVar15 + lVar36 + local_3e8 * -8) * local_3d8 + lVar23 +
                              local_3e0 * -8) * local_3d0 + local_3c8 * -8 + local_470;
                  local_470 = ((local_448 * lVar15 + lVar36 + local_3e8 * -8) * local_3d8 + lVar23 +
                              local_3e0 * -8) * local_3d0 + local_3c8 * -8 + local_470;
                  for (lVar16 = local_3f0; lVar25 = local_488, lVar17 = local_438,
                      lVar32 = local_470, lVar39 = lVar22, lVar37 = local_438 + 1,
                      lVar16 <= local_428; lVar16 = lVar16 + 1) {
                    while (lVar17 <= local_410) {
                      lVar17 = lVar17 + 1;
                      lVar33 = local_508.nstride * local_530 +
                               (lVar16 - local_508.begin.z) * local_508.kstride * 8 +
                               (lVar37 - local_508.begin.y) * local_508.jstride * 8 +
                               (long)local_508.begin.x * -8 + local_468;
                      for (lVar34 = 0; lVar30 + lVar34 <= local_408; lVar34 = lVar34 + 1) {
                        *(double *)((long)local_508.p + lVar34 * 8 + lVar33) =
                             *(double *)
                              ((long)local_4c8.p +
                              lVar34 * 8 +
                              local_4c8.nstride * local_530 +
                              (lVar37 - local_4c8.begin.y) * local_4c8.jstride * 8 +
                              (lVar16 - local_4c8.begin.z) * local_4c8.kstride * 8 +
                              (long)local_4c8.begin.x * -8 + local_468) * local_1b8 *
                             (*(double *)(lVar32 + lVar34 * 8) /
                             (*(double *)(lVar39 + lVar34 * 8) * dVar4 +
                             *(double *)(lVar25 + lVar34 * 8) * 0.5)) +
                             *(double *)((long)local_508.p + lVar34 * 8 + lVar33);
                      }
                      lVar37 = lVar37 + 1;
                      lVar39 = lVar39 + lVar19;
                      lVar25 = lVar25 + lVar19;
                      lVar32 = lVar32 + lVar19;
                    }
                    lVar22 = lVar22 + local_3b8;
                    local_488 = local_488 + local_3b8;
                    local_470 = local_470 + local_3b8;
                  }
                }
                else {
                  lVar19 = local_3c0 + local_468;
                  lVar17 = ((local_458 * lVar15 + lVar36 + local_3e8 * -8) * local_3d8 + lVar23 +
                           local_3e0 * -8) * local_3d0 + local_3c8 * -8 + lVar19;
                  local_130 = local_3d8 * local_3d0 * 8;
                  lVar16 = local_3d0 * 8;
                  lVar22 = local_3f0;
                  lVar25 = ((local_448 * lVar15 + lVar36 + local_3e8 * -8) * local_3d8 + lVar23 +
                           local_3e0 * -8) * local_3d0 + local_3c8 * -8 + lVar19;
                  lVar19 = ((local_450 * lVar15 + lVar36 + local_3e8 * -8) * local_3d8 + lVar23 +
                           local_3e0 * -8) * local_3d0 + local_3c8 * -8 + lVar19;
                  local_520 = local_3f0 + 1;
                  while (lVar39 = lVar19, lVar32 = lVar25, lVar22 <= local_428) {
                    lVar22 = lVar22 + 1;
                    lVar19 = lVar17;
                    lVar25 = lVar32;
                    lVar37 = lVar39;
                    for (lVar33 = local_438; lVar33 <= local_410; lVar33 = lVar33 + 1) {
                      lVar34 = local_508.nstride * local_530 +
                               (lVar33 - local_508.begin.y) * local_508.jstride * 8 +
                               (local_520 - local_508.begin.z) * local_508.kstride * 8 +
                               (long)local_508.begin.x * -8 + local_468;
                      for (lVar38 = 0; lVar30 + lVar38 <= local_408; lVar38 = lVar38 + 1) {
                        *(double *)((long)local_508.p + lVar38 * 8 + lVar34) =
                             *(double *)
                              ((long)local_4c8.p +
                              lVar38 * 8 +
                              local_4c8.nstride * local_530 +
                              (lVar33 - local_4c8.begin.y) * local_4c8.jstride * 8 +
                              (local_520 - local_4c8.begin.z) * local_4c8.kstride * 8 +
                              (long)local_4c8.begin.x * -8 + local_468) * local_1c8 *
                             (*(double *)(lVar25 + lVar38 * 8) /
                             (*(double *)(lVar19 + lVar38 * 8) * dVar5 +
                             *(double *)(lVar37 + lVar38 * 8) * 0.5)) +
                             *(double *)((long)local_508.p + lVar38 * 8 + lVar34);
                      }
                      lVar19 = lVar19 + lVar16;
                      lVar37 = lVar37 + lVar16;
                      lVar25 = lVar25 + lVar16;
                    }
                    local_520 = local_520 + 1;
                    lVar17 = lVar17 + local_130;
                    lVar25 = lVar32 + local_130;
                    lVar19 = lVar39 + local_130;
                    local_488 = lVar39;
                    local_470 = lVar32;
                    local_3b8 = lVar22;
                  }
                }
              }
              if (local_298 == Robin && !bVar12) {
                if (iVar21 == 0) {
                  local_540 = local_3c0 + local_480;
                  lVar25 = ((local_458 * lVar15 + lVar2 + local_3e8 * -8) * local_3d8 + lVar1 +
                           local_3e0 * -8) * local_3d0 + local_3c8 * -8 + local_540;
                  lVar22 = local_3d8 * local_3d0 * 8;
                  lVar19 = local_3d0 * 8;
                  lVar16 = ((local_450 * lVar15 + lVar2 + local_3e8 * -8) * local_3d8 + lVar1 +
                           local_3e0 * -8) * local_3d0 + local_3c8 * -8 + local_540;
                  local_540 = ((lVar15 * local_448 + lVar2 + local_3e8 * -8) * local_3d8 + lVar1 +
                              local_3e0 * -8) * local_3d0 + local_3c8 * -8 + local_540;
                  for (lVar15 = local_3f8; lVar17 = local_540, lVar32 = lVar16, lVar39 = local_440,
                      lVar37 = lVar25, lVar15 <= local_430; lVar15 = lVar15 + 1) {
                    for (; lVar39 <= local_418; lVar39 = lVar39 + 1) {
                      lVar38 = (lVar39 - local_508.begin.y) * local_508.jstride;
                      lVar33 = (lVar15 - local_508.begin.z) * local_508.kstride;
                      for (lVar34 = 0; lVar24 + lVar34 <= lVar26; lVar34 = lVar34 + 1) {
                        lVar29 = (long)((local_39c - local_508.begin.x) + (int)lVar34);
                        local_508.p[lVar38 + lVar33 + local_508.nstride * uVar31 + lVar29] =
                             *(double *)
                              ((long)local_4c8.p +
                              lVar34 * 8 +
                              local_4c8.nstride * local_530 +
                              (lVar39 - local_4c8.begin.y) * local_4c8.jstride * 8 +
                              (lVar15 - local_4c8.begin.z) * local_4c8.kstride * 8 +
                              (long)local_4c8.begin.x * -8 + local_480) * local_1c0 *
                             (*(double *)(lVar17 + lVar34 * 8) /
                             (*(double *)(lVar37 + lVar34 * 8) * dVar3 +
                             *(double *)(lVar32 + lVar34 * 8) * 0.5)) +
                             local_508.p[lVar38 + lVar33 + local_508.nstride * uVar31 + lVar29];
                      }
                      lVar17 = lVar17 + lVar19;
                      lVar32 = lVar32 + lVar19;
                      lVar37 = lVar37 + lVar19;
                    }
                    lVar25 = lVar25 + lVar22;
                    lVar16 = lVar16 + lVar22;
                    local_540 = local_540 + lVar22;
                  }
                }
                else if (iVar21 == 1) {
                  lVar22 = local_3c0 + local_480;
                  local_470 = local_3d8 * local_3d0 * 8;
                  lVar19 = local_3d0 * 8;
                  local_538 = ((local_450 * lVar15 + lVar2 + local_3e8 * -8) * local_3d8 + lVar1 +
                              local_3e0 * -8) * local_3d0 + local_3c8 * -8 + lVar22;
                  local_540 = ((lVar15 * local_448 + lVar2 + local_3e8 * -8) * local_3d8 + lVar1 +
                              local_3e0 * -8) * local_3d0 + local_3c8 * -8 + lVar22;
                  lVar15 = ((local_458 * lVar15 + lVar2 + local_3e8 * -8) * local_3d8 + lVar1 +
                           local_3e0 * -8) * local_3d0 + local_3c8 * -8 + lVar22;
                  for (lVar16 = local_3f8; lVar32 = lVar15, lVar15 = lVar32, lVar22 = local_540,
                      lVar25 = local_538, lVar17 = local_440, iVar14 = local_3fc,
                      lVar16 <= local_430; lVar16 = lVar16 + 1) {
                    for (; lVar17 <= local_418; lVar17 = lVar17 + 1) {
                      lVar39 = local_508.nstride * local_530 +
                               (iVar14 - local_508.begin.y) * local_508.jstride * 8 +
                               (lVar16 - local_508.begin.z) * local_508.kstride * 8 +
                               (long)local_508.begin.x * -8 + local_480;
                      for (lVar37 = 0; lVar24 + lVar37 <= lVar26; lVar37 = lVar37 + 1) {
                        *(double *)((long)local_508.p + lVar37 * 8 + lVar39) =
                             *(double *)
                              ((long)local_4c8.p +
                              lVar37 * 8 +
                              local_4c8.nstride * local_530 +
                              (lVar16 - local_4c8.begin.z) * local_4c8.kstride * 8 +
                              (lVar17 - local_4c8.begin.y) * local_4c8.jstride * 8 +
                              (long)local_4c8.begin.x * -8 + local_480) * local_1b8 *
                             (*(double *)(lVar22 + lVar37 * 8) /
                             (*(double *)(lVar15 + lVar37 * 8) * dVar4 +
                             *(double *)(lVar25 + lVar37 * 8) * 0.5)) +
                             *(double *)((long)local_508.p + lVar37 * 8 + lVar39);
                      }
                      lVar15 = lVar15 + lVar19;
                      lVar22 = lVar22 + lVar19;
                      lVar25 = lVar25 + lVar19;
                      iVar14 = iVar14 + 1;
                    }
                    local_538 = local_538 + local_470;
                    local_540 = local_540 + local_470;
                    lVar15 = lVar32 + local_470;
                    local_488 = lVar32;
                  }
                }
                else {
                  local_540 = local_3c0 + local_480;
                  local_538 = ((local_458 * lVar15 + lVar2 + local_3e8 * -8) * local_3d8 + lVar1 +
                              local_3e0 * -8) * local_3d0 + local_3c8 * -8 + local_540;
                  local_470 = local_3d8 * local_3d0 * 8;
                  lVar19 = local_3d0 * 8;
                  local_488 = ((local_450 * lVar15 + lVar2 + local_3e8 * -8) * local_3d8 + lVar1 +
                              local_3e0 * -8) * local_3d0 + local_3c8 * -8 + local_540;
                  local_540 = ((lVar15 * local_448 + lVar2 + local_3e8 * -8) * local_3d8 + lVar1 +
                              local_3e0 * -8) * local_3d0 + local_3c8 * -8 + local_540;
                  iVar14 = local_3a4;
                  for (lVar15 = local_3f8; lVar16 = local_540, lVar22 = local_440,
                      lVar25 = local_488, lVar17 = local_538, lVar15 <= local_430;
                      lVar15 = lVar15 + 1) {
                    for (; lVar22 <= local_418; lVar22 = lVar22 + 1) {
                      lVar32 = local_508.nstride * local_530 +
                               (iVar14 - local_508.begin.z) * local_508.kstride * 8 +
                               (lVar22 - local_508.begin.y) * local_508.jstride * 8 +
                               (long)local_508.begin.x * -8 + local_480;
                      for (lVar39 = 0; lVar24 + lVar39 <= lVar26; lVar39 = lVar39 + 1) {
                        *(double *)((long)local_508.p + lVar39 * 8 + lVar32) =
                             *(double *)
                              ((long)local_4c8.p +
                              lVar39 * 8 +
                              local_4c8.nstride * local_530 +
                              (lVar22 - local_4c8.begin.y) * local_4c8.jstride * 8 +
                              (lVar15 - local_4c8.begin.z) * local_4c8.kstride * 8 +
                              (long)local_4c8.begin.x * -8 + local_480) * local_1c8 *
                             (*(double *)(lVar16 + lVar39 * 8) /
                             (*(double *)(lVar17 + lVar39 * 8) * dVar5 +
                             *(double *)(lVar25 + lVar39 * 8) * 0.5)) +
                             *(double *)((long)local_508.p + lVar39 * 8 + lVar32);
                      }
                      lVar16 = lVar16 + lVar19;
                      lVar25 = lVar25 + lVar19;
                      lVar17 = lVar17 + lVar19;
                    }
                    iVar14 = iVar14 + 1;
                    local_538 = local_538 + local_470;
                    local_488 = local_488 + local_470;
                    local_540 = local_540 + local_470;
                  }
                }
              }
            }
            local_530 = local_530 + 8;
            local_458 = local_458 + 0x18;
            local_450 = local_450 + 0x18;
            local_448 = local_448 + 0x18;
            this = local_3b0;
            local_420 = uVar31;
            uVar9 = uVar31 + 1;
          }
        }
        lVar23 = local_478 + 1;
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
    BaseFab<double>::~BaseFab(&foo.super_BaseFab<double>);
  }
  return;
}

Assistant:

void
MLCellABecLap::applyInhomogNeumannTerm (int amrlev, Any& a_rhs) const
{
    bool has_inhomog_neumann = hasInhomogNeumannBC();
    bool has_robin = hasRobinBC();

    if (!has_inhomog_neumann && !has_robin) return;

    AMREX_ASSERT(a_rhs.is<MultiFab>());
    MultiFab& rhs = a_rhs.get<MultiFab>();

    int ncomp = getNComp();
    const int mglev = 0;

    const auto problo = m_geom[amrlev][mglev].ProbLoArray();
    const auto probhi = m_geom[amrlev][mglev].ProbHiArray();
    amrex::ignore_unused(probhi);
    const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
    const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : Real(1.0);
    const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : Real(1.0);
    const Real xlo = problo[0];
    const Real dx = m_geom[amrlev][mglev].CellSize(0);
    const Box& domain = m_geom[amrlev][mglev].Domain();

    const Real beta = getBScalar();
    Array<MultiFab const*, AMREX_SPACEDIM> const& bcoef = getBCoeffs(amrlev,mglev);
    FArrayBox foo(Box(IntVect(0),IntVect(1)));
    bool has_bcoef = (bcoef[0] != nullptr);

    const auto& maskvals = m_maskvals[amrlev][mglev];
    const auto& bcondloc = *m_bcondloc[amrlev][mglev];
    const auto& bndry = *m_bndry_sol[amrlev];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(rhs, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.validbox();
        Array4<Real> const& rhsfab = rhs.array(mfi);

        const auto & bdlv = bcondloc.bndryLocs(mfi);
        const auto & bdcv = bcondloc.bndryConds(mfi);

        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            Array4<Real const> const bfab = (has_bcoef)
                ? bcoef[idim]->const_array(mfi) : foo.const_array();
            const Orientation olo(idim,Orientation::low);
            const Orientation ohi(idim,Orientation::high);
            const Box blo = amrex::adjCellLo(vbx, idim);
            const Box bhi = amrex::adjCellHi(vbx, idim);
            const auto& mlo = maskvals[olo].array(mfi);
            const auto& mhi = maskvals[ohi].array(mfi);
            const auto& bvlo = bndry.bndryValues(olo).array(mfi);
            const auto& bvhi = bndry.bndryValues(ohi).array(mfi);
            bool outside_domain_lo = !(domain.contains(blo));
            bool outside_domain_hi = !(domain.contains(bhi));
            if ((!outside_domain_lo) && (!outside_domain_hi)) continue;
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                const BoundCond bctlo = bdcv[icomp][olo];
                const BoundCond bcthi = bdcv[icomp][ohi];
                const Real bcllo = bdlv[icomp][olo];
                const Real bclhi = bdlv[icomp][ohi];
                if (m_lobc_orig[icomp][idim] == LinOpBCType::inhomogNeumann && outside_domain_lo)
                {
                    if (idim == 0) {
                        Real fac = beta*dxi;
                        if (m_has_metric_term && !has_bcoef) {
#if (AMREX_SPACEDIM == 1)
                            fac *= problo[0]*problo[0];
#elif (AMREX_SPACEDIM == 2)
                            fac *= problo[0];
#endif
                        }
                        AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                        {
                            mllinop_apply_innu_xlo(i,j,k, rhsfab, mlo, bfab,
                                                   bctlo, bcllo, bvlo,
                                                   fac, has_bcoef, icomp);
                        });
                    } else if (idim == 1) {
                        Real fac = beta*dyi;
                        if (m_has_metric_term && !has_bcoef) {
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                mllinop_apply_innu_ylo_m(i,j,k, rhsfab, mlo,
                                                         bctlo, bcllo, bvlo,
                                                         fac, xlo, dx, icomp);
                            });
                        }
                        else {
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                mllinop_apply_innu_ylo(i,j,k, rhsfab, mlo, bfab,
                                                       bctlo, bcllo, bvlo,
                                                       fac, has_bcoef, icomp);
                            });
                        }
                    } else {
                        Real fac = beta*dzi;
                        AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                        {
                            mllinop_apply_innu_zlo(i,j,k, rhsfab, mlo, bfab,
                                                   bctlo, bcllo, bvlo,
                                                   fac, has_bcoef, icomp);
                        });
                    }
                }
                if (m_hibc_orig[icomp][idim] == LinOpBCType::inhomogNeumann && outside_domain_hi)
                {
                    if (idim == 0) {
                        Real fac = beta*dxi;
                        if (m_has_metric_term && !has_bcoef) {
#if (AMREX_SPACEDIM == 1)
                            fac *= probhi[0]*probhi[0];
#elif (AMREX_SPACEDIM == 2)
                            fac *= probhi[0];
#endif
                        }
                        AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                        {
                            mllinop_apply_innu_xhi(i,j,k, rhsfab, mhi, bfab,
                                                   bcthi, bclhi, bvhi,
                                                   fac, has_bcoef, icomp);
                        });
                    } else if (idim == 1) {
                        Real fac = beta*dyi;
                        if (m_has_metric_term && !has_bcoef) {
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                mllinop_apply_innu_yhi_m(i,j,k, rhsfab, mhi,
                                                         bcthi, bclhi, bvhi,
                                                         fac, xlo, dx, icomp);
                            });
                        } else {
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                mllinop_apply_innu_yhi(i,j,k, rhsfab, mhi, bfab,
                                                       bcthi, bclhi, bvhi,
                                                       fac, has_bcoef, icomp);
                            });
                        }
                    } else {
                        Real fac = beta*dzi;
                        AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                        {
                            mllinop_apply_innu_zhi(i,j,k, rhsfab, mhi, bfab,
                                                   bcthi, bclhi, bvhi,
                                                   fac, has_bcoef, icomp);
                        });
                    }
                }

                if (has_robin) {
                    // For Robin BC, see comments in AMReX_MLABecLaplacian.cpp above
                    // function applyRobinBCTermsCoeffs.
                    Array4<Real const> const& rbc = (*m_robin_bcval[amrlev])[mfi].const_array(icomp*3);
                    if (m_lobc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_lo)
                    {
                        if (idim == 0) {
                            Real fac = beta*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i+1,j,k,icomp) += fac*bfab(i+1,j,k,icomp)*A;
                            });
                        } else if (idim == 1) {
                            Real fac = beta*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j+1,k,icomp) += fac*bfab(i,j+1,k,icomp)*A;
                            });
                        } else {
                            Real fac = beta*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j,k+1,icomp) += fac*bfab(i,j,k+1,icomp)*A;
                            });
                        }
                    }
                    if (m_hibc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_hi)
                    {
                        if (idim == 0) {
                            Real fac = beta*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i-1,j,k,icomp) += fac*bfab(i,j,k,icomp)*A;
                            });
                        } else if (idim == 1) {
                            Real fac = beta*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j-1,k,icomp) += fac*bfab(i,j,k,icomp)*A;
                            });
                        } else {
                            Real fac = beta*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j,k-1,icomp) += fac*bfab(i,j,k,icomp)*A;
                            });
                        }
                    }
                }
            }
        }

    }
}